

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O1

int32_t icu_63::MeasureUnit::getAvailable
                  (char *type,MeasureUnit *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  int32_t iVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  
  uVar3 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar3 = 0;
    iVar1 = binarySearch((char **)gTypes,0,0x14,type);
    if (iVar1 != -1) {
      uVar3 = (&DAT_0032ddb4)[iVar1] - (&gOffsets)[iVar1];
      if (destCapacity < (int)uVar3) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else if (0 < (int)uVar3) {
        pcVar4 = dest->fCurrency;
        uVar2 = 0;
        do {
          *(int32_t *)(pcVar4 + -8) = iVar1;
          *(int32_t *)(pcVar4 + -4) = (int32_t)uVar2;
          *pcVar4 = '\0';
          uVar2 = uVar2 + 1;
          pcVar4 = pcVar4 + 0x18;
        } while (uVar3 != uVar2);
      }
    }
  }
  return uVar3;
}

Assistant:

int32_t MeasureUnit::getAvailable(
        const char *type,
        MeasureUnit *dest,
        int32_t destCapacity,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t typeIdx = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), type);
    if (typeIdx == -1) {
        return 0;
    }
    int32_t len = gOffsets[typeIdx + 1] - gOffsets[typeIdx];
    if (destCapacity < len) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return len;
    }
    for (int subTypeIdx = 0; subTypeIdx < len; ++subTypeIdx) {
        dest[subTypeIdx].setTo(typeIdx, subTypeIdx);
    }
    return len;
}